

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O0

void sensors_analytics::Sdk::ProfileSet(PropertiesNode *properties)

{
  Sdk *this;
  ObjectNode *properties_00;
  string *distinct_id;
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  ObjectNode *local_10;
  PropertiesNode *properties_local;
  
  this = instance_;
  if (instance_ != (Sdk *)0x0) {
    local_10 = &properties->super_ObjectNode;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"profile_set",&local_31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"",&local_69);
    properties_00 = local_10;
    distinct_id = &instance_->distinct_id_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"",&local_91);
    AddEvent(this,(string *)local_30,(string *)local_68,properties_00,distinct_id,(string *)local_90
            );
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  return;
}

Assistant:

void Sdk::ProfileSet(const PropertiesNode &properties) {
  if (instance_) {
    instance_->AddEvent("profile_set",
                        "",
                        properties,
                        instance_->distinct_id_,
                        "");
  }
}